

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O2

void __thiscall Centaurus::IndexVector::IndexVector(IndexVector *this,size_type n,bool reserve_flag)

{
  int iVar1;
  undefined7 in_register_00000011;
  size_type __n;
  allocator_type local_21;
  
  iVar1 = (int)CONCAT71(in_register_00000011,reserve_flag);
  __n = 0;
  if (iVar1 == 0) {
    __n = n;
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&this->super_vector<int,_std::allocator<int>_>,__n,&local_21);
  this->_vptr_IndexVector = (_func_int **)&PTR__IndexVector_001b3d20;
  if (iVar1 != 0) {
    std::vector<int,_std::allocator<int>_>::reserve
              (&this->super_vector<int,_std::allocator<int>_>,n);
  }
  return;
}

Assistant:

IndexVector(size_type n, bool reserve_flag = true)
        : std::vector<int>(reserve_flag ? 0 : n)
    {
        if (reserve_flag)
            reserve(n);
    }